

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::Iterator<short,_true,_std::allocator<unsigned_long>_>::testInvariant
          (Iterator<short,_true,_std::allocator<unsigned_long>_> *this)

{
  View<short,_true,_std::allocator<unsigned_long>_> *pVVar1;
  ulong uVar2;
  reference psVar3;
  unsigned_long uVar4;
  reference psVar5;
  runtime_error *prVar6;
  size_t sVar7;
  pointer puVar8;
  long lVar9;
  long lVar10;
  size_type __n;
  size_t sVar11;
  size_t dimension;
  vector<unsigned_long,_std::allocator<unsigned_long>_> testCoord;
  allocator_type local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  pVVar1 = this->view_;
  if (pVVar1 == (View<short,_true,_std::allocator<unsigned_long>_> *)0x0) {
    if ((((this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start) && (this->index_ == 0)) &&
       (this->pointer_ == (pointer)0x0)) {
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
  }
  else {
    uVar2 = *(ulong *)(pVVar1 + 0x30);
    if (uVar2 == 0) {
      if ((((this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) && (this->index_ == 0)) &&
         (this->pointer_ == (pointer)0x0)) {
        return;
      }
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Assertion failed.");
    }
    else {
      sVar11 = this->index_;
      if (uVar2 < sVar11) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
      }
      else {
        psVar3 = this->pointer_;
        if (sVar11 == uVar2) {
          psVar5 = View<short,_true,_std::allocator<unsigned_long>_>::operator()(pVVar1,uVar2 - 1);
          if (psVar3 != psVar5 + 1) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
            goto LAB_0021dcf5;
          }
        }
        else {
          psVar5 = View<short,_true,_std::allocator<unsigned_long>_>::operator()(pVVar1,sVar11);
          if (psVar3 != psVar5) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
            goto LAB_0021dcf5;
          }
        }
        pVVar1 = this->view_;
        View<short,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        if (pVVar1[0x3c] != (View<short,_true,_std::allocator<unsigned_long>_>)0x0) {
          return;
        }
        pVVar1 = this->view_;
        if (*(long *)pVVar1 == 0) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"Assertion failed.");
        }
        else {
          __n = (long)(this->coordinates_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->coordinates_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
          if (__n == *(size_type *)(pVVar1 + 0x28)) {
            if (this->index_ != *(size_t *)(pVVar1 + 0x30)) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_38,__n,&local_39);
              View<short,true,std::allocator<unsigned_long>>::
              indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<short,true,std::allocator<unsigned_long>> *)this->view_,this->index_,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )local_38.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start);
              puVar8 = (this->coordinates_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar9 = (long)(this->coordinates_).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
              if (lVar9 == 0) {
                if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start == (unsigned_long *)0x0) {
                  return;
                }
              }
              else {
                lVar9 = lVar9 >> 3;
                lVar10 = 0;
                do {
                  if (puVar8[lVar10] !=
                      local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar10]) {
                    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
                    __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
              }
              operator_delete(local_38.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_38.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_38.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              return;
            }
            View<short,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
            if (*(int *)(pVVar1 + 0x38) == 1) {
              sVar11 = *(this->coordinates_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              sVar7 = View<short,_true,_std::allocator<unsigned_long>_>::shape(this->view_,0);
              if (sVar11 == sVar7) {
                puVar8 = (this->coordinates_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(this->coordinates_).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar8) < 9) {
                  return;
                }
                sVar11 = 1;
                while (uVar4 = puVar8[sVar11],
                      sVar7 = View<short,_true,_std::allocator<unsigned_long>_>::shape
                                        (this->view_,sVar11), uVar4 == sVar7 - 1) {
                  sVar11 = sVar11 + 1;
                  puVar8 = (this->coordinates_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->coordinates_).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3)
                      <= sVar11) {
                    return;
                  }
                }
                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar6,"Assertion failed.");
              }
              else {
                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar6,"Assertion failed.");
              }
            }
            else {
              pVVar1 = this->view_;
              if (*(long *)pVVar1 == 0) {
                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar6,"Assertion failed.");
              }
              else {
                sVar11 = (this->coordinates_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[*(long *)(pVVar1 + 0x28) + -1];
                dimension = *(long *)(pVVar1 + 0x28) - 1;
                sVar7 = View<short,_true,_std::allocator<unsigned_long>_>::shape(pVVar1,dimension);
                if (sVar11 == sVar7) {
                  if (dimension == 0) {
                    return;
                  }
                  sVar11 = 0;
                  while (uVar4 = (this->coordinates_).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[sVar11],
                        sVar7 = View<short,_true,_std::allocator<unsigned_long>_>::shape
                                          (this->view_,sVar11), uVar4 == sVar7 - 1) {
                    sVar11 = sVar11 + 1;
                    if (dimension == sVar11) {
                      return;
                    }
                  }
                  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar6,"Assertion failed.");
                }
                else {
                  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar6,"Assertion failed.");
                }
              }
            }
          }
          else {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
          }
        }
      }
    }
  }
LAB_0021dcf5:
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void 
Iterator<T, isConst, A>::testInvariant() const
{
    if(!MARRAY_NO_DEBUG) {
        if(view_ == 0) { 
            marray_detail::Assert(coordinates_.size() == 0 
                && index_ == 0
                && pointer_ == 0);
        }
        else { 
            if(view_->size() == 0) { // un-initialized view
                marray_detail::Assert(coordinates_.size() == 0 
                    && index_ == 0
                    && pointer_ == 0);
            }
            else { // initialized view
                marray_detail::Assert(index_ >= 0 && index_ <= view_->size());
                if(index_ == view_->size()) { // end iterator
                    marray_detail::Assert(pointer_ == &((*view_)(view_->size()-1)) + 1);
                }
                else {
                    marray_detail::Assert(pointer_ == &((*view_)(index_)));
                }
                if(!view_->isSimple()) {
                    marray_detail::Assert(coordinates_.size() == view_->dimension());
                    if(index_ == view_->size()) { // end iterator
                        if(view_->coordinateOrder() == LastMajorOrder) {
                            marray_detail::Assert(coordinates_[0] == view_->shape(0));
                            for(std::size_t j=1; j<coordinates_.size(); ++j) {
                                marray_detail::Assert(coordinates_[j] == view_->shape(j)-1);
                            }
                        }
                        else { // FirstMajorOrder
                            std::size_t d = view_->dimension() - 1;
                            marray_detail::Assert(coordinates_[d] == view_->shape(d));
                            for(std::size_t j=0; j<d; ++j) {
                                marray_detail::Assert(coordinates_[j] == view_->shape(j)-1);
                            }
                        }
                    }
                    else {
                        std::vector<std::size_t> testCoord(coordinates_.size());
                        view_->indexToCoordinates(index_, testCoord.begin());
                        for(std::size_t j=0; j<coordinates_.size(); ++j) {
                            marray_detail::Assert(coordinates_[j] == testCoord[j]);
                        }
                    }
                }
            }
        }
    }
}